

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O0

int main(int argc,char **argv)

{
  int iVar1;
  long in_RSI;
  int in_EDI;
  int a;
  int strict;
  int allmeta;
  int verbose;
  int nfiles;
  int rv;
  int in_stack_0000005c;
  int in_stack_00000060;
  int in_stack_00000064;
  int in_stack_00000068;
  int in_stack_0000006c;
  char *in_stack_00000070;
  int iVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  int local_14;
  
  local_14 = 0;
  uVar5 = 0;
  uVar4 = 0;
  uVar3 = 0;
  iVar2 = 1;
  while( true ) {
    if (in_EDI <= iVar2) {
      return local_14;
    }
    iVar1 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"-h");
    if (((iVar1 == 0) || (iVar1 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"-?"), iVar1 == 0)) ||
       (iVar1 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"--help"), iVar1 == 0)) break;
    iVar1 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"--version");
    if (iVar1 == 0) {
      printf("exrinfo (OpenEXR) %s  https://openexr.com\n","3.2.0");
      printf("Copyright (c) Contributors to the OpenEXR Project\n");
      printf("License BSD-3-Clause\n");
      return 0;
    }
    iVar1 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"-v");
    if ((iVar1 == 0) ||
       (iVar1 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"--verbose"), iVar1 == 0)) {
      uVar5 = 1;
    }
    else {
      iVar1 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"-a");
      if ((iVar1 == 0) ||
         (iVar1 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"--all-metadata"), iVar1 == 0)) {
        uVar4 = 1;
      }
      else {
        iVar1 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"-s");
        if ((iVar1 == 0) ||
           (iVar1 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"--strict"), iVar1 == 0)) {
          uVar3 = 1;
        }
        else {
          iVar1 = strcmp(*(char **)(in_RSI + (long)iVar2 * 8),"-");
          if (iVar1 == 0) {
            iVar1 = process_stdin(in_stack_00000064,in_stack_00000060,in_stack_0000005c);
          }
          else {
            if (**(char **)(in_RSI + (long)iVar2 * 8) == '-') {
              usage((FILE *)CONCAT44(uVar5,uVar4),(char *)CONCAT44(uVar3,iVar2),0);
              return 1;
            }
            iVar1 = process_file(in_stack_00000070,in_stack_0000006c,in_stack_00000068,
                                 in_stack_00000064);
          }
          local_14 = iVar1 + local_14;
        }
      }
    }
    iVar2 = iVar2 + 1;
  }
  usage((FILE *)CONCAT44(uVar5,uVar4),(char *)CONCAT44(uVar3,iVar2),0);
  return 0;
}

Assistant:

int
main (int argc, const char* argv[])
{
    int rv = 0, nfiles = 0, verbose = 0, allmeta = 0, strict = 0;

    for (int a = 1; a < argc; ++a)
    {
        if (!strcmp (argv[a], "-h") || !strcmp (argv[a], "-?") ||
            !strcmp (argv[a], "--help"))
        {
            usage (stdout, "exrinfo", 1);
            return 0;
        }
        else if (!strcmp (argv[a], "--version"))
        {
            printf("exrinfo (OpenEXR) %s  https://openexr.com\n", OPENEXR_VERSION_STRING);
            printf("Copyright (c) Contributors to the OpenEXR Project\n");
            printf("License BSD-3-Clause\n");
            return 0;
        }
        else if (!strcmp (argv[a], "-v") || !strcmp (argv[a], "--verbose"))
        {
            verbose = 1;
        }
        else if (!strcmp (argv[a], "-a") || !strcmp (argv[a], "--all-metadata"))
        {
            allmeta = 1;
        }
        else if (!strcmp (argv[a], "-s") || !strcmp (argv[a], "--strict"))
        {
            strict = 1;
        }
        else if (!strcmp (argv[a], "-"))
        {
            ++nfiles;
            rv += process_stdin (verbose, allmeta, strict);
        }
        else if (argv[a][0] == '-')
        {
            usage (stderr, argv[0], 0);
            return 1;
        }
        else
        {
            ++nfiles;
            rv += process_file (argv[a], verbose, allmeta, strict);
        }
    }

    return rv;
}